

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void anon_unknown.dwarf_787a7::signal_handler(int signal)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  ostringstream os;
  char *local_1b0;
  ostringstream local_190 [376];
  
  __s = strsignal(signal);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"received signal ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,signal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  abnormal_program_termination(local_1b0);
}

Assistant:

void signal_handler(int signal) {
        const char* sigstr = strsignal(signal);
        std::ostringstream os;
        os << "received signal " << signal << " (" << sigstr << ")";
        abnormal_program_termination(os.str().c_str());
    }